

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O0

void EthBasePort::PrintEthernetPacket(ostream *out,quadlet_t *packet,uint max_quads)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  void *pvVar4;
  ARPHeader *arp;
  UDPHeader *udp;
  uint8_t *icmp;
  uint flags;
  IPv4Header *ipv4;
  FrameHeader *frame;
  uint16_t *packetw;
  uint max_quads_local;
  quadlet_t *packet_local;
  ostream *out_local;
  
  poVar3 = std::operator<<(out,"Ethernet Frame:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  PrintMAC(out,"  Dest MAC",(uint8_t *)packet,true);
  PrintMAC(out,"  Src MAC",(uint8_t *)((long)packet + 6),true);
  poVar3 = std::operator<<(out,"  Ethertype/Length: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
  _Var2 = std::setw(4);
  poVar3 = std::operator<<(poVar3,_Var2);
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(poVar3,_Var1._M_c);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,(ushort)packet[3]);
  std::ostream::operator<<(pvVar4,std::dec);
  if ((short)packet[3] == 0x800) {
    std::operator<<(out," (IPv4)");
  }
  else if ((short)packet[3] == 0x806) {
    std::operator<<(out," (ARP)");
  }
  std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  if ((short)packet[3] == 0x800) {
    poVar3 = std::operator<<(out,"  IPv4:");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(out,"    Version: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    poVar3 = (ostream *)
             std::ostream::operator<<(pvVar4,(int)(*(ushort *)((long)packet + 0xe) & 0xf000) >> 0xc)
    ;
    poVar3 = std::operator<<(poVar3,", IHL: ");
    pvVar4 = (void *)std::ostream::operator<<
                               (poVar3,(int)(*(ushort *)((long)packet + 0xe) & 0xf00) >> 8);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(out,"    Length: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,(ushort)packet[4]);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(out,"    Flags: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    std::ostream::operator<<(pvVar4,0);
    poVar3 = std::operator<<(out,", TTL: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,(uint)*(byte *)((long)packet + 0x17));
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(out,"    Protocol: ");
    std::ostream::operator<<(poVar3,(uint)*(byte *)((long)packet + 0x16));
    if (*(char *)((long)packet + 0x16) == '\x01') {
      std::operator<<(out," (ICMP)");
    }
    else if (*(char *)((long)packet + 0x16) == '\x11') {
      std::operator<<(out," (UDP)");
    }
    std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
    PrintIP(out,"    Host IP",(uint8_t *)((long)packet + 0x1a),true);
    PrintIP(out,"    Dest IP",(uint8_t *)((long)packet + 0x1e),true);
    if (*(char *)((long)packet + 0x16) == '\x01') {
      poVar3 = std::operator<<(out,"    ICMP:");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(out,"      Type: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)*(byte *)((long)packet + 0x23));
      poVar3 = std::operator<<(poVar3,", Code: ");
      std::ostream::operator<<(poVar3,(uint)*(byte *)((long)packet + 0x22));
      if ((*(char *)((long)packet + 0x23) == '\b') && (*(byte *)((long)packet + 0x22) == 0)) {
        std::operator<<(out," (Echo Request)");
      }
      std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
    }
    else if (*(char *)((long)packet + 0x16) == '\x11') {
      poVar3 = std::operator<<(out,"    UDP:");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = (ostream *)std::ostream::operator<<(out,std::dec);
      poVar3 = std::operator<<(poVar3,"      Host Port: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,*(ushort *)((long)packet + 0x22));
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      poVar3 = (ostream *)std::ostream::operator<<(out,std::dec);
      poVar3 = std::operator<<(poVar3,"      Dest Port: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,(ushort)packet[9]);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      poVar3 = (ostream *)std::ostream::operator<<(out,std::dec);
      poVar3 = std::operator<<(poVar3,"      Length: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,*(ushort *)((long)packet + 0x26));
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    }
  }
  else if ((short)packet[3] == 0x806) {
    poVar3 = std::operator<<(out,"  ARP:");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = (ostream *)std::ostream::operator<<(out,std::hex);
    poVar3 = std::operator<<(poVar3,"    htype:");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ushort *)((long)packet + 0x22));
    poVar3 = std::operator<<(poVar3,", ptype:");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)packet[9]);
    poVar3 = std::operator<<(poVar3,", hlen:");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)*(byte *)((long)packet + 0x27));
    poVar3 = std::operator<<(poVar3,", plen: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)*(byte *)((long)packet + 0x26));
    poVar3 = std::operator<<(poVar3,", oper:");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,(ushort)packet[10]);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::dec);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    PrintMAC(out,"    Src MAC",(uint8_t *)((long)packet + 0x2a),true);
    PrintIP(out,"    Src IP",(uint8_t *)(packet + 0xc),true);
    PrintIP(out,"    Dest IP",(uint8_t *)((long)packet + 0x3a),true);
  }
  else {
    poVar3 = std::operator<<(out,"  Raw frame (len = ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,(ushort)packet[3]);
    poVar3 = std::operator<<(poVar3,")");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void EthBasePort::PrintEthernetPacket(std::ostream &out, const quadlet_t *packet, unsigned int max_quads)
{
    struct FrameHeader {
        uint8_t  destMac[6];
        uint8_t  srcMac[6];
        uint16_t etherType;
    };
    struct IPv4Header {
        uint16_t word0;
        uint16_t length;
        uint16_t ident;
        uint16_t flags;
        uint8_t  protocol;
        uint8_t  ttl;
        uint16_t checksum;
        uint8_t  hostIP[4];
        uint8_t  destIP[4];
    };
    struct UDPHeader {
        uint16_t hostPort;
        uint16_t destPort;
        uint16_t length;
        uint16_t checksum;
    };
    struct ARPHeader {
        uint16_t htype;
        uint16_t ptype;
        uint8_t  plen;
        uint8_t  hlen;
        uint16_t oper;
        uint8_t  srcMac[6];
        uint8_t  srcIP[4];
        uint8_t  destMac[6];  // ignored
        uint8_t  destIP[4];
    };
    // Easier to work with 16-bit data, since that is how it is stored on FPGA.
    const uint16_t *packetw = reinterpret_cast<const uint16_t *>(packet);

    const FrameHeader *frame = reinterpret_cast<const FrameHeader *>(packetw);
    out << "Ethernet Frame:" << std::endl;
    EthBasePort::PrintMAC(out, "  Dest MAC", frame->destMac, true);
    EthBasePort::PrintMAC(out, "  Src MAC", frame->srcMac, true);
    out << "  Ethertype/Length: " << std::hex << std::setw(4) << std::setfill('0') << frame->etherType << std::dec;
    if (frame->etherType == 0x0800) out << " (IPv4)";
    else if (frame->etherType == 0x0806) out << " (ARP)";
    out << std::endl;
    if (frame->etherType == 0x0800) {
        const IPv4Header *ipv4 = reinterpret_cast<const IPv4Header *>(packetw+7);
        out << "  IPv4:" << std::endl;
        out << "    Version: " << std::dec << ((ipv4->word0&0xf000)>>12) << ", IHL: " << ((ipv4->word0&0x0f00)>>8) << std::endl;
        out << "    Length: " << std::dec << ipv4->length << std::endl;
        unsigned int flags = (ipv4->flags&0xc0)>>13;
        out << "    Flags: " << std::dec << flags;
        if (flags == 2) out << " (DF)";
        out << ", TTL: " << static_cast<unsigned int>(ipv4->ttl) << std::endl;
        out << "    Protocol: " << static_cast<unsigned int>(ipv4->protocol);
        if (ipv4->protocol == 1) out << " (ICMP)";
        else if (ipv4->protocol == 17) out << " (UDP)";
        out << std::endl;
        EthBasePort::PrintIP(out, "    Host IP", ipv4->hostIP, true);
        EthBasePort::PrintIP(out, "    Dest IP", ipv4->destIP, true);
        if (ipv4->protocol == 1) {
            const uint8_t *icmp = reinterpret_cast<const uint8_t *>(packetw+17);
            out << "    ICMP:" << std::endl;
            out << "      Type: " << static_cast<unsigned int>(icmp[1])
                << ", Code: " << static_cast<unsigned int>(icmp[0]);
            if ((icmp[1] == 8) && (icmp[0] == 0)) out << " (Echo Request)";
            out << std::endl;
        }
        else if (ipv4->protocol == 17) {
            const UDPHeader *udp = reinterpret_cast<const UDPHeader *>(packetw+17);
            out << "    UDP:" << std::endl;
            out << std::dec << "      Host Port: " << udp->hostPort << std::endl;
            out << std::dec << "      Dest Port: " << udp->destPort << std::endl;
            out << std::dec << "      Length: " << udp->length << std::endl;
        }
    }
    else if (frame->etherType == 0x0806) {
        const ARPHeader *arp = reinterpret_cast<const ARPHeader *>(packetw+17);
        out << "  ARP:" << std::endl;
        out << std::hex << "    htype:" << arp->htype << ", ptype:" << arp->ptype
            << ", hlen:" << static_cast<unsigned int>(arp->hlen)
            << ", plen: " << static_cast<unsigned int>(arp->plen)
            << ", oper:" << arp->oper << std::dec << std::endl;
        EthBasePort::PrintMAC(out, "    Src MAC", arp->srcMac, true);
        EthBasePort::PrintIP(out, "    Src IP", arp->srcIP, true);
        EthBasePort::PrintIP(out, "    Dest IP", arp->destIP, true);
    }
    else {
        out << "  Raw frame (len = " << std::dec << frame->etherType << ")" << std::endl;
    }
}